

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O3

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  byte bVar1;
  uint uVar2;
  int interval;
  int iVar3;
  itimerval tm;
  itimerval local_e8;
  sigaction local_c8;
  
  bVar1 = *mode;
  if (bVar1 == 0) {
    iVar3 = 10;
  }
  else {
    iVar3 = 10;
    do {
      mode = (char *)((byte *)mode + 1);
      uVar2 = (uint)bVar1;
      if ((bVar1 == 0x66) || (uVar2 == 0x6c)) {
        *(uint *)((L->glref).ptr64 + 0xefc) = uVar2;
        lj_trace_flushall(L);
      }
      else if (uVar2 == 0x69) {
        bVar1 = *mode;
        iVar3 = 0;
        if ((byte)(bVar1 - 0x30) < 10) {
          iVar3 = 0;
          do {
            iVar3 = (uint)(byte)(bVar1 - 0x30) + iVar3 * 10;
            bVar1 = ((byte *)mode)[1];
            mode = (char *)((byte *)mode + 1);
          } while ((byte)(bVar1 - 0x30) < 10);
        }
        if (iVar3 < 2) {
          iVar3 = 1;
        }
      }
      bVar1 = *mode;
    } while (bVar1 != 0);
  }
  if ((profile_state.g == (global_State *)0x0) ||
     (luaJIT_profile_stop(L), profile_state.g == (global_State *)0x0)) {
    profile_state.g = (global_State *)(L->glref).ptr64;
    profile_state.samples = 0;
    profile_state.sb.w = (char *)0x0;
    profile_state.sb.e = (char *)0x0;
    profile_state.sb.b = (char *)0x0;
    local_e8.it_interval.tv_sec = (__time_t)(iVar3 / 1000);
    local_e8.it_interval.tv_usec = (__suseconds_t)((iVar3 % 1000) * 1000);
    profile_state.cb = cb;
    profile_state.data = data;
    profile_state.sb.L.ptr64 = (uint64_t)L;
    profile_state.interval = iVar3;
    local_e8.it_value.tv_sec = local_e8.it_interval.tv_sec;
    local_e8.it_value.tv_usec = local_e8.it_interval.tv_usec;
    setitimer(ITIMER_PROF,&local_e8,(itimerval *)0x0);
    local_c8.sa_flags = 0x10000000;
    local_c8.__sigaction_handler.sa_handler = profile_signal;
    sigemptyset(&local_c8.sa_mask);
    sigaction(0x1b,&local_c8,(sigaction *)&profile_state.oldsa);
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->interval = interval;
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  profile_timer_start(ps);
}